

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O0

Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
* __thiscall
Corrade::Containers::BasicStringView<const_char>::split
          (Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
           *__return_storage_ptr__,BasicStringView<const_char> *this,StringView delimiter)

{
  ostream *output;
  bool bVar1;
  BasicStringView<const_char> BVar2;
  BasicStringView<const_char> local_b0;
  BasicStringView<const_char> local_a0;
  char *local_90;
  char *pos;
  char *oldpos;
  char *end;
  Flags local_61;
  Error local_60;
  size_t local_38;
  size_t delimiterSize;
  char *delimiterData;
  BasicStringView<const_char> *this_local;
  StringView delimiter_local;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  *parts;
  
  delimiter_local._data = (char *)delimiter._sizePlusFlags;
  this_local = (BasicStringView<const_char> *)delimiter._data;
  delimiterData = (char *)this;
  delimiter_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  delimiterSize = (size_t)data((BasicStringView<const_char> *)&this_local);
  local_38 = size((BasicStringView<const_char> *)&this_local);
  if (local_38 != 0) {
    end._3_1_ = 0;
    Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
    ::Array(__return_storage_ptr__);
    oldpos = BasicStringView<const_char>::end(this);
    pos = this->_data;
    while( true ) {
      bVar1 = false;
      if (pos < oldpos) {
        local_90 = Implementation::stringFindString
                             (pos,(long)oldpos - (long)pos,(char *)delimiterSize,local_38);
        bVar1 = local_90 != (char *)0x0;
      }
      if (!bVar1) break;
      BVar2 = slice(this,pos,local_90);
      local_a0 = BVar2;
      arrayAppend<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
                (__return_storage_ptr__,&local_a0);
      pos = local_90 + local_38;
    }
    bVar1 = isEmpty(this);
    if (!bVar1) {
      local_b0 = suffix(this,pos);
      arrayAppend<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
                (__return_storage_ptr__,&local_b0);
    }
    return __return_storage_ptr__;
  }
  output = Utility::Error::defaultOutput();
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_61);
  Utility::Error::Error(&local_60,output,local_61);
  Utility::Debug::operator<<
            (&local_60.super_Debug,"Containers::StringView::split(): delimiter is empty");
  Utility::Error::~Error(&local_60);
  abort();
}

Assistant:

Array<BasicStringView<T>> BasicStringView<T>::split(const StringView delimiter) const {
    const char* const delimiterData = delimiter.data();
    const std::size_t delimiterSize = delimiter.size();
    CORRADE_ASSERT(delimiterSize, "Containers::StringView::split(): delimiter is empty", {});

    Array<BasicStringView<T>> parts;
    const char* const end = this->end();
    const char* oldpos = _data;
    const char* pos;
    while(oldpos < end && (pos = Implementation::stringFindString(oldpos, end - oldpos, delimiterData, delimiterSize))) {
        arrayAppend(parts, slice(const_cast<T*>(oldpos), const_cast<T*>(pos)));
        oldpos = pos + delimiterSize;
    }

    if(!isEmpty())
        arrayAppend(parts, suffix(const_cast<T*>(oldpos)));

    return parts;
}